

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

MethodDefSig * __thiscall
winmd::reader::MemberRef::MethodSignature(MethodDefSig *__return_storage_ptr__,MemberRef *this)

{
  table_base *table;
  undefined1 local_28 [8];
  byte_view cursor;
  MemberRef *this_local;
  
  cursor.m_last = (uint8_t *)this;
  row_base<winmd::reader::MemberRef>::get_blob
            ((row_base<winmd::reader::MemberRef> *)local_28,(uint32_t)this);
  table = row_base<winmd::reader::MemberRef>::get_table
                    (&this->super_row_base<winmd::reader::MemberRef>);
  MethodDefSig::MethodDefSig(__return_storage_ptr__,table,(byte_view *)local_28);
  return __return_storage_ptr__;
}

Assistant:

MethodDefSig MethodSignature() const
        {
            auto cursor = get_blob(2);
            return{ get_table(), cursor };
        }